

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

istream * __thiscall nivalis::Plotter::import_binary_func_and_env(Plotter *this,istream *is)

{
  pointer pFVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  util::read_bin<unsigned_long>(is,&this->curr_func);
  util::resize_from_read_bin<std::vector<nivalis::Function,std::allocator<nivalis::Function>>>
            (is,&this->funcs);
  lVar3 = 0;
  for (uVar2 = 0;
      pFVar1 = (this->funcs).
               super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar2 < (ulong)(((long)(this->funcs).
                             super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1) / 0x130);
      uVar2 = uVar2 + 1) {
    Function::from_bin((Function *)((long)(pFVar1->line_color).data + lVar3 + -0x20),is);
    lVar3 = lVar3 + 0x130;
  }
  util::read_bin<nivalis::Plotter::View>(is,&this->view);
  util::read_bin<unsigned_int>(is,&this->x_var);
  util::read_bin<unsigned_int>(is,&this->y_var);
  util::read_bin<unsigned_int>(is,&this->t_var);
  util::read_bin<unsigned_int>(is,&this->r_var);
  Environment::from_bin(&this->env,is);
  return is;
}

Assistant:

std::istream& Plotter::import_binary_func_and_env(std::istream& is) {
    util::read_bin(is, curr_func);
    util::resize_from_read_bin(is, funcs);
    for (size_t i = 0; i < funcs.size(); ++i) {
        funcs[i].from_bin(is);
    }
    util::read_bin(is, view);
    util::read_bin(is, x_var);
    util::read_bin(is, y_var);
    util::read_bin(is, t_var);
    util::read_bin(is, r_var);
    env.from_bin(is);
    return is;
}